

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_resample_filters.cpp
# Opt level: O1

float basisu::kaiser_filter(float t)

{
  int iVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double sum;
  double dVar6;
  double dVar7;
  
  fVar3 = -t;
  if (-t <= t) {
    fVar3 = t;
  }
  fVar2 = 0.0;
  if (fVar3 < 3.0) {
    dVar5 = (double)fVar3 * 3.141592653589793;
    if (0.009999999776482582 <= ABS(dVar5)) {
      dVar7 = sin(dVar5);
      dVar7 = dVar7 / dVar5;
    }
    else {
      dVar7 = ((dVar5 * dVar5) / 120.0 + -0.1666666716337204) * dVar5 * dVar5 + 1.0;
    }
    dVar5 = (double)fVar3 / 3.0;
    dVar5 = 1.0 - dVar5 * dVar5;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar6 = 1.0;
    iVar1 = 1;
    dVar4 = 1.0;
    do {
      dVar6 = dVar6 * ((dVar5 * 4.12258768081665 * 0.5) / (double)iVar1);
      dVar4 = dVar4 + dVar6 * dVar6;
      iVar1 = iVar1 + 1;
    } while (dVar4 * 1e-16 < dVar6 * dVar6);
    dVar6 = 1.0;
    iVar1 = 1;
    dVar5 = 1.0;
    do {
      dVar6 = dVar6 * (2.061293840408325 / (double)iVar1);
      dVar5 = dVar5 + dVar6 * dVar6;
      iVar1 = iVar1 + 1;
    } while (dVar5 * 1e-16 < dVar6 * dVar6);
    dVar7 = dVar7 * (dVar4 / dVar5);
    fVar2 = 0.0;
    if (1.249999968422344e-05 <= ABS(dVar7)) {
      fVar2 = (float)dVar7;
    }
  }
  return fVar2;
}

Assistant:

static float kaiser_filter(float t)
	{
		if (t < 0.0f)
			t = -t;

		if (t < KAISER_SUPPORT)
		{
			// db atten
			const float att = 40.0f;
			const float alpha = (float)(exp(log((double)0.58417 * (att - 20.96)) * 0.4) + 0.07886 * (att - 20.96));
			//const float alpha = KAISER_ALPHA;
			return (float)clean(sinc(t) * kaiser(alpha, KAISER_SUPPORT, t));
		}

		return 0.0f;
	}